

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O3

int dill_is_label_mark(dill_stream_conflict s)

{
  private_ctx pdVar1;
  
  pdVar1 = s->p;
  if (0 < (pdVar1->branch_table).max_alloc) {
    return (int)(*(pdVar1->branch_table).label_locs ==
                *(int *)&pdVar1->cur_ip - *(int *)&pdVar1->code_base);
  }
  return 0;
}

Assistant:

extern int
dill_is_label_mark(dill_stream s)
{
    struct branch_table* t = &s->p->branch_table;
    int i;
    int current_loc = (int)((char*)s->p->cur_ip - (char*)s->p->code_base);
    for (i = 0; i < t->max_alloc; i++) {
        if (t->label_locs[0] == current_loc)
            return 1;
    }
    return 0;
}